

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O1

void xcb_input_input_state_next(xcb_input_input_state_iterator_t *i)

{
  xcb_input_input_state_t *pxVar1;
  int iVar2;
  xcb_input_input_state_t *_aux;
  long in_FS_OFFSET;
  xcb_input_input_state_data_t _aux_1;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  int32_t *local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pxVar1 = i->data;
  local_28 = (int32_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  iVar2 = xcb_input_input_state_data_unpack
                    (pxVar1 + 1,pxVar1->class_id,(xcb_input_input_state_data_t *)&local_78);
  i->index = (int)(xcb_input_input_state_t *)(&pxVar1->class_id + (iVar2 + 2)) - *(int *)&i->data;
  i->rem = i->rem + -1;
  i->data = (xcb_input_input_state_t *)(&pxVar1->class_id + (iVar2 + 2));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
xcb_input_input_state_next (xcb_input_input_state_iterator_t *i)
{
    xcb_input_input_state_t *R = i->data;
    xcb_generic_iterator_t child;
    child.data = (xcb_input_input_state_t *)(((char *)R) + xcb_input_input_state_sizeof(R));
    i->index = (char *) child.data - (char *) i->data;
    --i->rem;
    i->data = (xcb_input_input_state_t *) child.data;
}